

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::Functions::ACos::ACos(ACos *this)

{
  Interval local_d8;
  Interval local_c0;
  Interval local_a8;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  allocator<char> local_31;
  string local_30;
  ACos *local_10;
  ACos *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"acos",&local_31);
  tcu::Interval::Interval(&local_78,-1.0);
  tcu::Interval::Interval(&local_90,1.0);
  tcu::Interval::Interval(&local_60,&local_78,&local_90);
  tcu::Interval::Interval(&local_c0,0.0);
  tcu::Interval::Interval(&local_d8,3.141592653589793);
  tcu::Interval::Interval(&local_a8,&local_c0,&local_d8);
  ArcTrigFunc::ArcTrigFunc(&this->super_ArcTrigFunc,&local_30,deAcos,4096.0,&local_60,&local_a8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_ArcTrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__ACos_01683be8;
  return;
}

Assistant:

ACos (void) : ArcTrigFunc("acos", deAcos, 4096.0,
							  Interval(-1.0, 1.0),
							  Interval(0.0, DE_PI_DOUBLE)) {}